

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

string * __thiscall
smf::MidiFile::getGMInstrumentName_abi_cxx11_
          (string *__return_storage_ptr__,MidiFile *this,int patchIndex)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)(uint)this < 0) {
    pcVar2 = "";
    paVar1 = &local_9;
  }
  else if ((uint)this < 0x80) {
    pcVar2 = *(char **)(GMinstrument + ((ulong)this & 0xffffffff) * 8);
    paVar1 = &local_b;
  }
  else {
    pcVar2 = "";
    paVar1 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string MidiFile::getGMInstrumentName(int patchIndex) {
	if (patchIndex < 0) {
		return "";
	}
	if (patchIndex > 127) {
		return "";
	}
	return GMinstrument[patchIndex];
}